

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

void js_promise_mark(JSRuntime *rt,JSValue val,JS_MarkFunc *mark_func)

{
  long lVar1;
  long lVar2;
  JSPromiseReactionData *rd;
  long lVar3;
  bool bVar4;
  
  if (((int)val.tag == -1) && (*(short *)((long)val.u.ptr + 6) == 0x2a)) {
    lVar1 = *(long *)((long)val.u.ptr + 0x30);
  }
  else {
    lVar1 = 0;
  }
  if (lVar1 != 0) {
    lVar2 = 0;
    do {
      for (lVar3 = *(long *)(lVar1 + 0x10 + lVar2 * 0x10); lVar3 != lVar1 + 8 + lVar2 * 0x10;
          lVar3 = *(long *)(lVar3 + 8)) {
        if ((*(uint *)(lVar3 + 0x18) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar3 + 0x10));
        }
        if ((*(uint *)(lVar3 + 0x28) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar3 + 0x20));
        }
        if ((*(uint *)(lVar3 + 0x38) & 0xfffffffe) == 0xfffffffe) {
          (*mark_func)(rt,*(JSGCObjectHeader **)(lVar3 + 0x30));
        }
      }
      bVar4 = lVar2 == 0;
      lVar2 = lVar2 + 1;
    } while (bVar4);
    if ((*(uint *)(lVar1 + 0x38) & 0xfffffffe) == 0xfffffffe) {
      (*mark_func)(rt,*(JSGCObjectHeader **)(lVar1 + 0x30));
    }
  }
  return;
}

Assistant:

static void js_promise_mark(JSRuntime *rt, JSValueConst val,
                            JS_MarkFunc *mark_func)
{
    JSPromiseData *s = JS_GetOpaque(val, JS_CLASS_PROMISE);
    struct list_head *el;
    int i;

    if (!s)
        return;
    for(i = 0; i < 2; i++) {
        list_for_each(el, &s->promise_reactions[i]) {
            JSPromiseReactionData *rd =
                list_entry(el, JSPromiseReactionData, link);
            JS_MarkValue(rt, rd->resolving_funcs[0], mark_func);
            JS_MarkValue(rt, rd->resolving_funcs[1], mark_func);
            JS_MarkValue(rt, rd->handler, mark_func);
        }
    }
    JS_MarkValue(rt, s->promise_result, mark_func);
}